

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

int64_t mtree_atol(char **p,int base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  char c;
  char *pcVar5;
  long lVar6;
  long lVar7;
  
  pcVar5 = *p;
  if (base == 0) {
    c = *pcVar5;
    if (c == '0') {
      if ((byte)(pcVar5[1] | 0x20U) != 0x78) {
        c = '0';
        base = 8;
        goto LAB_0050fa92;
      }
      pcVar5 = pcVar5 + 2;
      *p = pcVar5;
      base = 0x10;
      goto LAB_0050f9e7;
    }
    base = 10;
  }
  else {
LAB_0050f9e7:
    c = *pcVar5;
  }
  if (c == '-') {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = CONCAT44(0,base);
    auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000);
    lVar4 = SUB168(auVar2 / auVar1,0);
    lVar6 = 0;
    lVar7 = -lVar4;
    while( true ) {
      pcVar5 = pcVar5 + 1;
      *p = pcVar5;
      uVar3 = parsedigit(*pcVar5);
      if ((int)uVar3 < 0) {
        return lVar6;
      }
      if (base <= (int)uVar3) {
        return lVar6;
      }
      if (SBORROW8(lVar6,lVar7) != lVar6 + lVar4 < 0) {
        return -0x8000000000000000;
      }
      if ((lVar6 == lVar7) && (-SUB164(auVar2 % auVar1,0) < (int)uVar3)) break;
      lVar6 = lVar6 * CONCAT44(0,base) - (ulong)uVar3;
    }
    return -0x8000000000000000;
  }
LAB_0050fa92:
  auVar2._8_8_ = 0;
  auVar2._0_8_ = CONCAT44(0,base);
  auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff);
  lVar4 = SUB168(auVar1 / auVar2,0);
  lVar6 = 0;
  while( true ) {
    pcVar5 = pcVar5 + 1;
    uVar3 = parsedigit(c);
    if ((int)uVar3 < 0) {
      return lVar6;
    }
    if (base <= (int)uVar3) break;
    if ((lVar4 < lVar6) || ((lVar6 == lVar4 && (SUB164(auVar1 % auVar2,0) < (int)uVar3)))) {
      return 0x7fffffffffffffff;
    }
    lVar6 = lVar6 * CONCAT44(0,base) + (ulong)uVar3;
    *p = pcVar5;
    c = *pcVar5;
  }
  return lVar6;
}

Assistant:

static int64_t
mtree_atol(char **p, int base)
{
	int64_t l, limit;
	int digit, last_digit_limit;

	if (base == 0) {
		if (**p != '0')
			base = 10;
		else if ((*p)[1] == 'x' || (*p)[1] == 'X') {
			*p += 2;
			base = 16;
		} else {
			base = 8;
		}
	}

	if (**p == '-') {
		limit = INT64_MIN / base;
		last_digit_limit = INT64_MIN % base;
		++(*p);

		l = 0;
		digit = parsedigit(**p);
		while (digit >= 0 && digit < base) {
			if (l < limit || (l == limit && digit > last_digit_limit))
				return INT64_MIN;
			l = (l * base) - digit;
			digit = parsedigit(*++(*p));
		}
		return l;
	} else {
		limit = INT64_MAX / base;
		last_digit_limit = INT64_MAX % base;

		l = 0;
		digit = parsedigit(**p);
		while (digit >= 0 && digit < base) {
			if (l > limit || (l == limit && digit > last_digit_limit))
				return INT64_MAX;
			l = (l * base) + digit;
			digit = parsedigit(*++(*p));
		}
		return l;
	}
}